

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.cpp
# Opt level: O1

vector<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_> * __thiscall
csm::GeometricModel::getParameters
          (vector<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_>
           *__return_storage_ptr__,GeometricModel *this,Set pSet)

{
  pointer pPVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  vector<int,_std::allocator<int>_> local_b0;
  GeometricModel *local_98;
  long *local_90 [2];
  long local_80 [2];
  undefined8 local_70;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = this;
  getParameterSetIndices(&local_b0,this,pSet);
  uVar4 = (uint)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  if (0 < (int)uVar4) {
    std::vector<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_>::
    resize(__return_storage_ptr__,(ulong)(uVar4 & 0x7fffffff));
    lVar3 = 0x28;
    uVar2 = 0;
    do {
      (*(local_98->super_Model)._vptr_Model[0x1d])
                ((string *)local_90,local_98,
                 (ulong)(uint)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar2]);
      pPVar1 = (__return_storage_ptr__->
               super__Vector_base<csm::GeometricModel::Parameter,_std::allocator<csm::GeometricModel::Parameter>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::operator=((string *)((long)pPVar1 + lVar3 + -0x28),(string *)local_90);
      *(undefined8 *)((long)pPVar1 + lVar3 + -8) = local_70;
      std::__cxx11::string::operator=
                ((string *)((long)&(pPVar1->name)._M_dataplus._M_p + lVar3),(string *)local_68);
      *(undefined8 *)((long)&(pPVar1->units)._M_string_length + lVar3) = local_38;
      *(undefined8 *)((long)&pPVar1->value + lVar3) = local_48;
      *(undefined8 *)((long)&(pPVar1->units)._M_dataplus._M_p + lVar3) = uStack_40;
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x60;
    } while ((uVar4 & 0x7fffffff) != uVar2);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

void GeometricModel::setParameter(int index,const Parameter& param)
{
   //***
   // Derived classes may have the ability to adjust all parameter attributes,
   // but no methods exist at this level to change anything but the value and
   // type.  Each of the individual "set" calls is responsible for range
   // checking the desired index, so no need to do that here.
   //***
   setParameterValue (index,param.value);
   setParameterType  (index,param.type);
}